

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O1

int history_def_del(void *p,HistEvent_conflict *ev,int num)

{
  HistEvent_conflict *ev_00;
  int iVar1;
  int iVar2;
  char *pcVar3;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  
  iVar1 = history_def_set(p,ev,num);
  iVar2 = -1;
  if (iVar1 == 0) {
    ev_00 = *(HistEvent_conflict **)((long)p + 0x28);
    pcVar3 = strdup(ev_00->str);
    ev->str = pcVar3;
    ev->num = ev_00->num;
    history_def_delete((history_t *)p,ev_00,(hentry_t_conflict *)CONCAT44(extraout_var,extraout_EDX)
                      );
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
history_def_del(void *p, TYPE(HistEvent) *ev __attribute__((__unused__)),
    const int num)
{
	history_t *h = (history_t *) p;
	if (history_def_set(h, ev, num) != 0)
		return -1;
	ev->str = Strdup(h->cursor->ev.str);
	ev->num = h->cursor->ev.num;
	history_def_delete(h, ev, h->cursor);
	return 0;
}